

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# postproc_filters_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_199679b::PostprocFiltersTestLarge_MD5Match_Test::
~PostprocFiltersTestLarge_MD5Match_Test(PostprocFiltersTestLarge_MD5Match_Test *this)

{
  pointer pcVar1;
  
  (this->super_PostprocFiltersTestLarge).super_PostprocFiltersTest.
  super_CodecTestWith2Params<int,_unsigned_int>.
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_int,_unsigned_int>_>.super_Test.
  _vptr_Test = (_func_int **)&PTR__PostprocFiltersTest_0108a0f0;
  (this->super_PostprocFiltersTestLarge).super_PostprocFiltersTest.
  super_CodecTestWith2Params<int,_unsigned_int>.
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_int,_unsigned_int>_>.
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_int,_unsigned_int>_>.
  _vptr_WithParamInterface = (_func_int **)&PTR__PostprocFiltersTest_0108a148;
  (this->super_PostprocFiltersTestLarge).super_PostprocFiltersTest.super_EncoderTest.
  _vptr_EncoderTest = (_func_int **)&PTR__PostprocFiltersTest_0108a168;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_PostprocFiltersTestLarge).super_PostprocFiltersTest.md5_enc_);
  (this->super_PostprocFiltersTestLarge).super_PostprocFiltersTest.super_EncoderTest.
  _vptr_EncoderTest = (_func_int **)&PTR__EncoderTest_01081d70;
  pcVar1 = (this->super_PostprocFiltersTestLarge).super_PostprocFiltersTest.super_EncoderTest.stats_
           .buffer_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 !=
      &(this->super_PostprocFiltersTestLarge).super_PostprocFiltersTest.super_EncoderTest.stats_.
       buffer_.field_2) {
    operator_delete(pcVar1);
  }
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_P(PostprocFiltersTestLarge, MD5Match) { DoTest(); }